

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.hpp
# Opt level: O2

index __thiscall
boost::detail::multi_array::
multi_array_impl_base<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,2ul>
::calculate_descending_dimension_offset<boost::array<long,2ul>,boost::array<unsigned_long,2ul>>
          (multi_array_impl_base<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,2ul>
           *this,array<long,_2UL> *stride_list,array<unsigned_long,_2UL> *extent_list,
          general_storage_order<2UL> *storage)

{
  index iVar1;
  long lVar2;
  
  if ((((storage->ascending_).elems[0] & 1U) == 0) || (((storage->ascending_).elems[1] & 1U) == 0))
  {
    iVar1 = 0;
    for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
      if ((storage->ascending_).elems[lVar2] == false) {
        iVar1 = iVar1 - (extent_list->elems[lVar2] - 1) * stride_list->elems[lVar2];
      }
    }
  }
  else {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

index
  calculate_descending_dimension_offset(const StrideList& stride_list,
                                const ExtentList& extent_list,
                                const general_storage_order<NumDims>& storage)
  {
    index offset = 0;
    if (!storage.all_dims_ascending()) 
      for (size_type n = 0; n != NumDims; ++n)
        if (!storage.ascending(n))
          offset -= (extent_list[n] - 1) * stride_list[n];

    return offset;
  }